

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O2

LLVMValueRef CompileLlvmArray(LlvmCompilationContext *ctx,ExprArray *node)

{
  ExprBase *expression;
  TypeBase *valueType;
  LLVMValueRef pLVar1;
  TypeBase *valueType_00;
  IntrusiveList<ExprBase> *pIVar2;
  
  CompileLlvmType(ctx,(node->super_ExprBase).type);
  pIVar2 = &node->values;
  while (expression = pIVar2->head, expression != (ExprBase *)0x0) {
    pLVar1 = CompileLlvm(ctx,expression);
    valueType = expression->type;
    valueType_00 = GetStackType(ctx,valueType);
    ConvertToDataType(ctx,pLVar1,valueType_00,valueType);
    pIVar2 = (IntrusiveList<ExprBase> *)&expression->next;
  }
  pLVar1 = CheckType(ctx,&node->super_ExprBase,(LLVMValueRef)&placeholderValue);
  return pLVar1;
}

Assistant:

LLVMValueRef CompileLlvmArray(LlvmCompilationContext &ctx, ExprArray *node)
{
	LLVMValueRef storage = LLVMBuildAlloca(ctx.builder, CompileLlvmType(ctx, node->type), "arr_lit");

	unsigned i = 0;

	for(ExprBase *value = node->values.head; value; value = value->next)
	{
		LLVMValueRef element = CompileLlvm(ctx, value);

		LLVMValueRef indices[] = { LLVMConstInt(LLVMInt32TypeInContext(ctx.context), 0, true), LLVMConstInt(LLVMInt32TypeInContext(ctx.context), i, true) };

		LLVMValueRef address = LLVMBuildGEP(ctx.builder, storage, indices, 2, "");

		element = ConvertToDataType(ctx, element, GetStackType(ctx, value->type), value->type);

		LLVMBuildStore(ctx.builder, element, address);

		i++;
	}

	LLVMValueRef result = LLVMBuildLoad(ctx.builder, storage, "");

	return CheckType(ctx, node, result);
}